

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

AsmJsCodeGenerator * __thiscall Js::ScriptContext::InitAsmJsCodeGenerator(ScriptContext *this)

{
  HeapAllocator *alloc;
  AsmJsCodeGenerator *this_00;
  TrackAllocData local_38;
  ScriptContext *local_10;
  ScriptContext *this_local;
  
  if (this->asmJsCodeGenerator == (AsmJsCodeGenerator *)0x0) {
    local_10 = this;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_38,(type_info *)&AsmJsCodeGenerator::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
               ,0x56e);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_38);
    this_00 = (AsmJsCodeGenerator *)new<Memory::HeapAllocator>(0x90,alloc,0x350bd0);
    AsmJsCodeGenerator::AsmJsCodeGenerator(this_00,this);
    this->asmJsCodeGenerator = this_00;
  }
  return this->asmJsCodeGenerator;
}

Assistant:

AsmJsCodeGenerator* ScriptContext::InitAsmJsCodeGenerator()
    {
        if( !asmJsCodeGenerator )
        {
            asmJsCodeGenerator = HeapNew( AsmJsCodeGenerator, this );
        }
        return asmJsCodeGenerator;
    }